

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hop.h
# Opt level: O3

Hop_Obj_t * Hop_ManFetchMemory(Hop_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Hop_Obj_t *pHVar5;
  
  pHVar5 = p->pListFree;
  if (pHVar5 == (Hop_Obj_t *)0x0) {
    Hop_ManAddMemory(p);
    pHVar5 = p->pListFree;
  }
  p->pListFree = (Hop_Obj_t *)pHVar5->field_0;
  pHVar5->pFanin0 = (Hop_Obj_t *)0x0;
  pHVar5->pFanin1 = (Hop_Obj_t *)0x0;
  (pHVar5->field_0).pData = (void *)0x0;
  (pHVar5->field_1).pNext = (Hop_Obj_t *)0x0;
  *(undefined8 *)&pHVar5->field_0x20 = 0;
  pVVar3 = p->vObjs;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    uVar1 = p->nCreated;
    if (uVar1 != pVVar3->nSize) {
      __assert_fail("p->nCreated == Vec_PtrSize(p->vObjs)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                    ,0xf0,"Hop_Obj_t *Hop_ManFetchMemory(Hop_Man_t *)");
    }
    if (uVar1 == pVVar3->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = 0x10;
      }
      else {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar4 = pVVar3->pArray;
    }
    iVar2 = pVVar3->nSize;
    pVVar3->nSize = iVar2 + 1;
    ppvVar4[iVar2] = pHVar5;
  }
  iVar2 = p->nCreated;
  p->nCreated = iVar2 + 1;
  pHVar5->Id = iVar2;
  return pHVar5;
}

Assistant:

static inline Hop_Obj_t * Hop_ManFetchMemory( Hop_Man_t * p )  
{ 
    Hop_Obj_t * pTemp;
    if ( p->pListFree == NULL )
        Hop_ManAddMemory( p );
    pTemp = p->pListFree;
    p->pListFree = *((Hop_Obj_t **)pTemp);
    memset( pTemp, 0, sizeof(Hop_Obj_t) ); 
    if ( p->vObjs )
    {
        assert( p->nCreated == Vec_PtrSize(p->vObjs) );
        Vec_PtrPush( p->vObjs, pTemp );
    }
    pTemp->Id = p->nCreated++;
    return pTemp;
}